

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_gz.c
# Opt level: O2

void * nhr_gz_decompress(void *buff,size_t buff_size,size_t *decompressed_size,uchar method)

{
  int iVar1;
  void *mem;
  ulong uVar2;
  ulong new_size;
  z_stream zip;
  
  if (buff_size != 0 && buff != (void *)0x0) {
    zip.adler = 0;
    zip.reserved = 0;
    zip.opaque = (voidpf)0x0;
    zip.data_type = 0;
    zip._92_4_ = 0;
    zip.zalloc = (alloc_func)0x0;
    zip.zfree = (free_func)0x0;
    zip.msg = (char *)0x0;
    zip.state = (internal_state *)0x0;
    zip.avail_out = 0;
    zip._36_4_ = 0;
    zip.total_out = 0;
    zip.total_in = 0;
    zip.next_out = (Bytef *)0x0;
    if (method == '\0') {
      zip._8_8_ = buff_size & 0xffffffff;
      zip.next_in = (Bytef *)buff;
      iVar1 = inflateInit_(&zip,"1.2.11",0x70);
    }
    else {
      if (buff_size < 0x13) {
        return (void *)0x0;
      }
      if (*buff != '\x1f') {
        return (void *)0x0;
      }
      if (*(char *)((long)buff + 1) != -0x75) {
        return (void *)0x0;
      }
      zip._12_4_ = 0;
      zip.avail_in = (int)buff_size - 0x12;
      zip.next_in = (Bytef *)((long)buff + 10);
      iVar1 = inflateInit2_(&zip,0xfffffffffffffff1,"1.2.11",0x70);
    }
    if (iVar1 == 0) {
      new_size = 0x200;
      mem = nhr_malloc(0x200);
      zip.avail_out = 0x200;
      uVar2 = 0;
      while( true ) {
        zip.next_out = (Bytef *)((long)mem + uVar2);
        iVar1 = inflate(&zip,0);
        if ((iVar1 + 4U < 7) && ((0x47U >> (iVar1 + 4U & 0x1f) & 1) != 0)) break;
        if ((int)(0x200 - zip.avail_out) < 1) {
          inflateEnd(&zip);
          nhr_free(mem);
          return (void *)0x0;
        }
        uVar2 = uVar2 + (0x200 - zip.avail_out);
        if (new_size <= uVar2) {
          new_size = new_size + 0x200;
          mem = nhr_realloc(mem,new_size);
          zip.avail_out = 0x200;
        }
        if (iVar1 == 1) {
          inflateEnd(&zip);
          if (decompressed_size != (size_t *)0x0) {
            *decompressed_size = uVar2;
            return mem;
          }
          return mem;
        }
      }
      nhr_free(mem);
      inflateEnd(&zip);
    }
  }
  return (void *)0x0;
}

Assistant:

void * nhr_gz_decompress(const void * buff,
						 const size_t buff_size,
						 size_t * decompressed_size,
						 const unsigned char method) {
	z_stream zip;
	Bytef * out_buff = NULL;
	size_t writed = 0, out_size = NHR_GZ_CHUNK_SIZE;
	int available_size = 0, result = Z_ERRNO;

	if (!buff || buff_size == 0) {
		return NULL;
	}
	memset(&zip, 0, sizeof(z_stream));

	if (method == NHR_GZ_METHOD_DEFLATE) {
		zip.avail_in = (uInt)buff_size;
		zip.next_in = (Bytef *)buff;
		result = inflateInit(&zip);
	} else if (nhr_gz_is_gzip_file((Bytef *)buff, buff_size)) {
		zip.avail_in = (uInt)(buff_size - NHR_GZ_HEADER_FOOTER_SIZE);
		zip.next_in = (Bytef *)buff + NHR_GZ_HEADER_SIZE;
		result = inflateInit2(&zip, NHR_GZ_WINDOWS_BITS);
	}

	if (result != Z_OK) {
		return NULL;
	}

	out_buff = (Bytef *)nhr_malloc(NHR_GZ_CHUNK_SIZE);

	zip.avail_out = NHR_GZ_CHUNK_SIZE;

	do {
		zip.next_out = out_buff + writed;

		result = inflate(&zip, Z_NO_FLUSH);
		switch (result) {
			case Z_NEED_DICT:
				result = Z_DATA_ERROR;
			case Z_DATA_ERROR:
			case Z_MEM_ERROR:
			case Z_STREAM_ERROR:
				nhr_free(out_buff);
				inflateEnd(&zip);
				return NULL;
		}
		available_size = ((int)NHR_GZ_CHUNK_SIZE) - zip.avail_out;
		if (available_size > 0) {
			writed += available_size;
			if (writed < out_size) {
				zip.avail_out = ((int)NHR_GZ_CHUNK_SIZE) - available_size;
			} else {
				out_size += NHR_GZ_CHUNK_SIZE;
				out_buff = (Bytef *)nhr_realloc(out_buff, out_size);
				zip.avail_out = NHR_GZ_CHUNK_SIZE;
			}
		} else {
			inflateEnd(&zip);
			nhr_free(out_buff);
			return NULL;
		}
	} while (result != Z_STREAM_END);

	inflateEnd(&zip);

	if (decompressed_size) {
		*decompressed_size = writed;
	}
	return out_buff;
}